

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O2

bool __thiscall DeleteMessage::fillMe(DeleteMessage *this,string *message)

{
  int iVar1;
  bool bVar2;
  
  if (this->parameter_count == 1) {
    if ((message->_M_string_length != 0) &&
       (iVar1 = (int)*(message->_M_dataplus)._M_p, 0xfffffff5 < iVar1 - 0x3aU && iVar1 != 0x30)) {
      bVar2 = false;
      iVar1 = std::__cxx11::stoi(message,(size_t *)0x0,10);
      this->chosen_message = iVar1;
      goto LAB_00103df5;
    }
  }
  else if ((this->parameter_count == 0) && (0xfffffffffffffff6 < message->_M_string_length - 10)) {
    this->parameter_count = 1;
    std::__cxx11::string::_M_assign((string *)&this->username);
    std::__cxx11::string::pop_back();
    bVar2 = true;
    goto LAB_00103df5;
  }
  bVar2 = false;
LAB_00103df5:
  std::__cxx11::string::assign((char *)&(this->super_ServerOperation).statusMessage);
  return bVar2;
}

Assistant:

bool DeleteMessage::fillMe(string message) {
    //fill the needed parameter

    switch(parameter_count){
        case 0:
            ///first parameter, check if valid input for a userdirectory
            if(message.length() <= 9 && message.length() > 0){
                parameter_count ++;
                username = message;
                username.pop_back();
                ///give user the information to next input, if everything went well
                statusMessage = "Message-number:";
                return true;
            }else {
                ///if invalid input, send the information to the client and return false
                statusMessage = "invalid username - Max 8 Characters!";
                return false;
            }
        case 1:
            ///check if second input is valid, if yes save the messagenumber.
            if(!message.empty() && isdigit(message[0]) && message[0] != '0'){
                chosen_message = stoi(message);
                ///change status to "ready for execute"
                statusMessage = EXECUTEPENDING;
                return false;
            }else{
                statusMessage = "Invalid Message-Number - Must be a number bigger than 0!";
                return false;
            }
        default:
            ///shouldn't be called anyway - if there is. return false and break this function.
            statusMessage = "Fatal Error! Parameter is not set! Connection closed";
            return false;
    }
}